

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write.c
# Opt level: O0

archive * archive_write_new(void)

{
  archive_vtable_conflict *paVar1;
  uchar *__s;
  uchar *nulls;
  archive_write *a;
  
  a = (archive_write *)malloc(0x118);
  if (a == (archive_write *)0x0) {
    a = (archive_write *)0x0;
  }
  else {
    memset(a,0,0x118);
    (a->archive).magic = 0xb0c5c0de;
    (a->archive).state = 1;
    paVar1 = archive_write_vtable();
    (a->archive).vtable = paVar1;
    a->bytes_per_block = 0x2800;
    a->bytes_in_last_block = -1;
    a->null_length = 0x400;
    __s = (uchar *)malloc(a->null_length);
    if (__s == (uchar *)0x0) {
      free(a);
      a = (archive_write *)0x0;
    }
    else {
      memset(__s,0,a->null_length);
      a->nulls = __s;
    }
  }
  return &a->archive;
}

Assistant:

struct archive *
archive_write_new(void)
{
	struct archive_write *a;
	unsigned char *nulls;

	a = (struct archive_write *)malloc(sizeof(*a));
	if (a == NULL)
		return (NULL);
	memset(a, 0, sizeof(*a));
	a->archive.magic = ARCHIVE_WRITE_MAGIC;
	a->archive.state = ARCHIVE_STATE_NEW;
	a->archive.vtable = archive_write_vtable();
	/*
	 * The value 10240 here matches the traditional tar default,
	 * but is otherwise arbitrary.
	 * TODO: Set the default block size from the format selected.
	 */
	a->bytes_per_block = 10240;
	a->bytes_in_last_block = -1;	/* Default */

	/* Initialize a block of nulls for padding purposes. */
	a->null_length = 1024;
	nulls = (unsigned char *)malloc(a->null_length);
	if (nulls == NULL) {
		free(a);
		return (NULL);
	}
	memset(nulls, 0, a->null_length);
	a->nulls = nulls;
	return (&a->archive);
}